

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O3

double __thiscall
imrt::IntensityILS::iLocalSearch(IntensityILS *this,Plan *P,double max_time,bool verbose)

{
  double *pdVar1;
  uint i;
  int j;
  undefined8 *******pppppppuVar2;
  undefined8 *******pppppppuVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Station *pSVar7;
  ostream *poVar8;
  _List_node_base *p_Var9;
  Station *s;
  bool bVar10;
  pointer ppVar11;
  double dVar12;
  double dVar13;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> cells;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double local_a0;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_90;
  double local_78;
  _List_node_base *local_70;
  pointer local_68;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_60;
  undefined8 *******local_48;
  undefined8 *******local_40;
  undefined8 local_38;
  
  pSVar7 = (Station *)Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (&local_90,(list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)pSVar7);
  local_48 = &local_48;
  local_38 = 0;
  local_40 = local_48;
  Plan::getEvaluation(P);
  p_Var9 = (_List_node_base *)&local_90;
  do {
    p_Var9 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&p_Var9->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var9 == (_List_node_base *)&local_90) break;
    s = (Station *)p_Var9[1]._M_next;
    getShuffledCells(&local_60,(IntensityILS *)pSVar7,s);
    local_70 = p_Var9;
    local_68 = local_60.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppVar11 = local_60.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = true;
      s = pSVar7;
    }
    else {
      do {
        i = ppVar11->first;
        j = ppVar11->second;
        iVar5 = rand();
        iVar6 = 0;
        bVar4 = true;
        do {
          bVar10 = bVar4;
          dVar12 = (s->I).p[(int)i][j];
          if (iVar5 % 2 == iVar6) {
            pSVar7 = (Station *)(ulong)i;
            local_a0 = Station::intensityUp(s,i,j);
          }
          else {
            pSVar7 = (Station *)(ulong)i;
            local_a0 = Station::intensityDown(s,i,j);
          }
          pdVar1 = (s->I).p[(int)i] + j;
          if ((local_a0 != *pdVar1) || (NAN(local_a0) || NAN(*pdVar1))) {
            dVar12 = local_a0 - dVar12;
            pSVar7 = s;
            dVar13 = Plan::get_delta_eval(P,s,i,j,dVar12,999999);
            if (dVar13 < -0.05) {
              poVar8 = std::ostream::_M_insert<double>(dVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
              poVar8 = std::ostream::_M_insert<double>(dVar12);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              Station::change_intensity
                        (s,i,j,local_a0,
                         (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         0x0);
              local_78 = Plan::incremental_eval(P,s,i,j,dVar12);
              bVar4 = false;
              goto LAB_0012c931;
            }
          }
          iVar6 = 1;
          bVar4 = false;
        } while (bVar10);
        ppVar11 = ppVar11 + 1;
      } while (ppVar11 != local_68);
      bVar4 = true;
      s = pSVar7;
    }
LAB_0012c931:
    if (local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    p_Var9 = local_70;
    pSVar7 = s;
  } while (bVar4);
  pppppppuVar3 = local_48;
  while ((undefined8 ********)pppppppuVar3 != &local_48) {
    pppppppuVar2 = (undefined8 *******)*pppppppuVar3;
    operator_delete(pppppppuVar3);
    pppppppuVar3 = pppppppuVar2;
  }
  while (local_90.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_90) {
    p_Var9 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
              &(local_90.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl
                ._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(local_90.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_90.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var9;
  }
  return local_78;
}

Assistant:

double IntensityILS::iLocalSearch(Plan& P, double max_time, bool verbose){
		 const list<Station*> stations=P.get_stations();
		 list< pair< int, double > > diff;
		 double eval =P.getEvaluation();

		 for(auto s:stations){
			  vector < pair<int, int> > cells = getShuffledCells(s);
				for(auto cell:cells){
					int a=rand()%2;
					for(int b=0; b<2;b++){
					  int i=cell.first, j=cell.second;
            double intensity, old=s->I(i,j);
						if(a==b) intensity=s->intensityUp(i,j);
						else intensity=s->intensityDown(i,j);
						if(intensity==s->I(i,j)) continue;
            double delta_eval = P.get_delta_eval (*s, i, j, intensity-old);

						if(delta_eval<-0.05){
              cout << delta_eval << ":" << intensity-old << endl;
              //cout << P.getEvaluationFunction()->get_impact_beamlet(s->getAngle(),s->pos2beam[make_pair(i,j)]) << endl;
              s->change_intensity(i, j, intensity);
              return P.incremental_eval(*s, i, j, intensity-old);
            }

					}
				}
		 }
	 }